

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coreaction.cc
# Opt level: O0

bool ActionInferTypes::propagateTypeEdge(TypeFactory *typegrp,PcodeOp *op,int4 inslot,int4 outslot)

{
  bool bVar1;
  OpCode OVar2;
  uint4 uVar3;
  int4 iVar4;
  type_metatype tVar5;
  int4 iVar6;
  Varnode *pVVar7;
  PcodeOp *this;
  Architecture *pAVar8;
  AddrSpace *pAVar9;
  Address *pAVar10;
  Datatype *pDVar11;
  Varnode *local_88;
  Varnode *local_80;
  AddrSpace *spc_3;
  AddrSpace *spc_2;
  Datatype *btype;
  AddrSpace *spc_1;
  Varnode *invn_1;
  AddrSpace *spc;
  Datatype *alttype;
  Datatype *newtype;
  Varnode *outvn;
  Varnode *invn;
  int4 outslot_local;
  int4 inslot_local;
  PcodeOp *op_local;
  TypeFactory *typegrp_local;
  
  if (outslot == -1) {
    local_80 = PcodeOp::getOut(op);
  }
  else {
    local_80 = PcodeOp::getIn(op,outslot);
  }
  bVar1 = Varnode::isAnnotation(local_80);
  if (bVar1) {
    typegrp_local._7_1_ = false;
  }
  else {
    bVar1 = Varnode::isTypeLock(local_80);
    if (bVar1) {
      typegrp_local._7_1_ = false;
    }
    else {
      if (inslot == -1) {
        local_88 = PcodeOp::getOut(op);
      }
      else {
        local_88 = PcodeOp::getIn(op,inslot);
      }
      alttype = Varnode::getTempType(local_88);
      bVar1 = propagateGoodEdge(op,inslot,outslot,local_88);
      if (bVar1) {
        OVar2 = PcodeOp::code(op);
        switch(OVar2) {
        case CPUI_COPY:
        case CPUI_INT_EQUAL:
        case CPUI_INT_NOTEQUAL:
        case CPUI_INT_LESS:
        case CPUI_INT_LESSEQUAL:
        case CPUI_INT_XOR:
        case CPUI_INT_AND:
        case CPUI_INT_OR:
        case CPUI_MULTIEQUAL:
        case CPUI_INDIRECT:
          bVar1 = Varnode::isSpacebase(local_88);
          if (bVar1) {
            pAVar8 = TypeFactory::getArch(typegrp);
            pAVar9 = AddrSpaceManager::getDefaultSpace(&pAVar8->super_AddrSpaceManager);
            iVar6 = Datatype::getSize(alttype);
            pDVar11 = TypeFactory::getBase(typegrp,1,TYPE_UNKNOWN);
            uVar3 = AddrSpace::getWordSize(pAVar9);
            alttype = &TypeFactory::getTypePointer(typegrp,iVar6,pDVar11,uVar3)->super_Datatype;
          }
          break;
        case CPUI_LOAD:
          if (inslot == -1) {
            pVVar7 = PcodeOp::getIn(op,0);
            pAVar10 = Varnode::getAddr(pVVar7);
            pAVar9 = Address::getSpaceFromConst(pAVar10);
            pDVar11 = Varnode::getTempType(local_80);
            iVar6 = Datatype::getSize(pDVar11);
            uVar3 = AddrSpace::getWordSize(pAVar9);
            alttype = &TypeFactory::getTypePointerNoDepth(typegrp,iVar6,alttype,uVar3)->
                       super_Datatype;
          }
          else {
            tVar5 = Datatype::getMetatype(alttype);
            if (tVar5 == TYPE_PTR) {
              alttype = TypePointer::getPtrTo((TypePointer *)alttype);
              iVar6 = Datatype::getSize(alttype);
              pDVar11 = Varnode::getTempType(local_80);
              iVar4 = Datatype::getSize(pDVar11);
              if (iVar6 != iVar4) {
                alttype = Varnode::getTempType(local_80);
              }
            }
            else {
              alttype = Varnode::getTempType(local_80);
            }
          }
          break;
        case CPUI_STORE:
          if (inslot == 2) {
            pVVar7 = PcodeOp::getIn(op,0);
            pAVar10 = Varnode::getAddr(pVVar7);
            pAVar9 = Address::getSpaceFromConst(pAVar10);
            pDVar11 = Varnode::getTempType(local_80);
            iVar6 = Datatype::getSize(pDVar11);
            uVar3 = AddrSpace::getWordSize(pAVar9);
            alttype = &TypeFactory::getTypePointerNoDepth(typegrp,iVar6,alttype,uVar3)->
                       super_Datatype;
          }
          else {
            tVar5 = Datatype::getMetatype(alttype);
            if (tVar5 == TYPE_PTR) {
              alttype = TypePointer::getPtrTo((TypePointer *)alttype);
              iVar6 = Datatype::getSize(alttype);
              pDVar11 = Varnode::getTempType(local_80);
              iVar4 = Datatype::getSize(pDVar11);
              if (iVar6 != iVar4) {
                alttype = Varnode::getTempType(local_80);
              }
            }
            else {
              alttype = Varnode::getTempType(local_80);
            }
          }
          break;
        default:
          return false;
        case CPUI_INT_ADD:
          bVar1 = Varnode::isConstant(local_80);
          if ((!bVar1) || (tVar5 = Datatype::getMetatype(alttype), tVar5 == TYPE_PTR)) {
            if (inslot == -1) {
              pVVar7 = PcodeOp::getIn(op,outslot);
              alttype = Varnode::getTempType(pVVar7);
            }
            else {
              alttype = propagateAddIn2Out(typegrp,op,inslot);
            }
          }
          break;
        case CPUI_PTRADD:
        case CPUI_PTRSUB:
          if (inslot == -1) {
            pVVar7 = PcodeOp::getIn(op,outslot);
            alttype = Varnode::getTempType(pVVar7);
          }
          else {
            alttype = propagateAddIn2Out(typegrp,op,inslot);
          }
          break;
        case CPUI_SEGMENTOP:
          pAVar8 = TypeFactory::getArch(typegrp);
          pAVar9 = AddrSpaceManager::getDefaultSpace(&pAVar8->super_AddrSpaceManager);
          pDVar11 = TypePointer::getPtrTo((TypePointer *)alttype);
          iVar6 = Varnode::getSize(local_80);
          uVar3 = AddrSpace::getWordSize(pAVar9);
          alttype = &TypeFactory::getTypePointer(typegrp,iVar6,pDVar11,uVar3)->super_Datatype;
          break;
        case CPUI_NEW:
          pVVar7 = PcodeOp::getIn(op,0);
          bVar1 = Varnode::isWritten(pVVar7);
          if (!bVar1) {
            return false;
          }
          this = Varnode::getDef(pVVar7);
          OVar2 = PcodeOp::code(this);
          if (OVar2 != CPUI_CPOOLREF) {
            return false;
          }
        }
        pDVar11 = Varnode::getTempType(local_80);
        iVar6 = Datatype::typeOrder(alttype,pDVar11);
        if (iVar6 < 0) {
          Varnode::setTempType(local_80,alttype);
          bVar1 = Varnode::isMark(local_80);
          typegrp_local._7_1_ = (bool)((bVar1 ^ 0xffU) & 1);
        }
        else {
          typegrp_local._7_1_ = false;
        }
      }
      else {
        typegrp_local._7_1_ = false;
      }
    }
  }
  return typegrp_local._7_1_;
}

Assistant:

bool ActionInferTypes::propagateTypeEdge(TypeFactory *typegrp,PcodeOp *op,int4 inslot,int4 outslot)
  
{
  Varnode *invn,*outvn;
  Datatype *newtype;

  outvn = (outslot==-1) ? op->getOut() : op->getIn(outslot);
  if (outvn->isAnnotation()) return false;
  if (outvn->isTypeLock()) return false; // Can't propagate through typelock
  invn = (inslot==-1) ? op->getOut() : op->getIn(inslot);
  Datatype *alttype = invn->getTempType();
  if (!propagateGoodEdge(op,inslot,outslot,invn))
    return false;

  switch(op->code()) {
  case CPUI_INDIRECT:
  case CPUI_COPY:
  case CPUI_MULTIEQUAL:
  case CPUI_INT_LESS:
  case CPUI_INT_LESSEQUAL:
  case CPUI_INT_EQUAL:
  case CPUI_INT_NOTEQUAL:
  case CPUI_INT_AND:
  case CPUI_INT_OR:
  case CPUI_INT_XOR:
    if (invn->isSpacebase()) {
      AddrSpace *spc = typegrp->getArch()->getDefaultSpace();
      newtype = typegrp->getTypePointer(alttype->getSize(),typegrp->getBase(1,TYPE_UNKNOWN),spc->getWordSize());
    }
    else
      newtype = alttype;
    break;
  case CPUI_NEW:
    {
      Varnode *invn = op->getIn(0);
      if (!invn->isWritten()) return false;		// Don't propagate
      if (invn->getDef()->code() != CPUI_CPOOLREF) return false;
      newtype = alttype;		// Propagate cpool result as result of new operator
    }
    break;
  case CPUI_SEGMENTOP:
    {
      AddrSpace *spc = typegrp->getArch()->getDefaultSpace();
      Datatype *btype = ((TypePointer *)alttype)->getPtrTo();
      newtype = typegrp->getTypePointer(outvn->getSize(),btype,spc->getWordSize());
    }
    break;
  case CPUI_LOAD:
    if (inslot == -1) {	 // Propagating output to input (value to ptr)
      AddrSpace *spc = Address::getSpaceFromConst(op->getIn(0)->getAddr());
      newtype = typegrp->getTypePointerNoDepth(outvn->getTempType()->getSize(),alttype,spc->getWordSize());
    }
    else if (alttype->getMetatype()==TYPE_PTR) {
      newtype = ((TypePointer *)alttype)->getPtrTo();
      if (newtype->getSize() != outvn->getTempType()->getSize()) // Size must be appropriate
	newtype = outvn->getTempType();
    }
    else
      newtype = outvn->getTempType(); // Don't propagate anything
    break;
  case CPUI_STORE:
    if (inslot==2) {		// Propagating value to ptr
      AddrSpace *spc = Address::getSpaceFromConst(op->getIn(0)->getAddr());
      newtype = typegrp->getTypePointerNoDepth(outvn->getTempType()->getSize(),alttype,spc->getWordSize());
    }
    else if (alttype->getMetatype()==TYPE_PTR) {
      newtype = ((TypePointer *)alttype)->getPtrTo();
      if (newtype->getSize() != outvn->getTempType()->getSize())
	newtype = outvn->getTempType();
    }
    else
      newtype = outvn->getTempType(); // Don't propagate anything
    break;
  case CPUI_PTRADD:
  case CPUI_PTRSUB:
    if (inslot == -1)		// Propagating output to input
      newtype = op->getIn(outslot)->getTempType();	// Don't propagate pointer types this direction
    else
      newtype = propagateAddIn2Out(typegrp,op,inslot);
    break;
  case CPUI_INT_ADD:
    if (outvn->isConstant() && (alttype->getMetatype() != TYPE_PTR))
      newtype = alttype;
    else if (inslot == -1)		// Propagating output to input
      newtype = op->getIn(outslot)->getTempType();	// Don't propagate pointer types this direction
    else
      newtype = propagateAddIn2Out(typegrp,op,inslot);
    break;
  default:
    return false;		// Don't propagate along this edge
  }
  if (0>newtype->typeOrder(*outvn->getTempType())) {
#ifdef TYPEPROP_DEBUG
    propagationDebug(typegrp->getArch(),outvn,newtype,op,inslot,(Varnode *)0);
#endif
    outvn->setTempType(newtype);
    return !outvn->isMark();
  }
  return false;
}